

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brkiter.cpp
# Opt level: O2

void __thiscall
icu_63::ICUBreakIteratorService::ICUBreakIteratorService(ICUBreakIteratorService *this)

{
  ICUBreakIteratorFactory *this_00;
  UnicodeString *dname;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UErrorCode status;
  
  local_70.p_ = L"Break Iterator";
  UnicodeString::UnicodeString((UnicodeString *)&status,'\x01',&local_70,0xe);
  dname = (UnicodeString *)&status;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString((UnicodeString *)&status);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUBreakIteratorService_003a9750;
  status = U_ZERO_ERROR;
  this_00 = (ICUBreakIteratorFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 != (ICUBreakIteratorFactory *)0x0) {
    memset(this_00,0,0x90);
    ICUBreakIteratorFactory::ICUBreakIteratorFactory(this_00);
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&status);
  return;
}

Assistant:

ICUBreakIteratorService()
        : ICULocaleService(UNICODE_STRING("Break Iterator", 14))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUBreakIteratorFactory(), status);
    }